

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * read_file(char *path)

{
  FILE *__stream;
  size_t __n;
  char *contents;
  size_t length;
  FILE *f;
  char *path_local;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    path_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    rewind(__stream);
    path_local = (char *)malloc(__n + 1);
    fread(path_local,1,__n,__stream);
    fclose(__stream);
    path_local[__n] = '\0';
  }
  return path_local;
}

Assistant:

char * read_file(char *path) {
	FILE *f = fopen(path, "r");
	if (f == NULL) {
		return NULL;
	}

	// Get the length of the file
	// TODO: proper error handling; so many of these functions set errno
	fseek(f, 0, SEEK_END);
	size_t length = (size_t) ftell(f);
	rewind(f);

	// Read its contents
	char *contents = malloc(length + 1);
	fread(contents, sizeof(char), length, f);
	fclose(f);
	contents[length] = '\0';
	return contents;
}